

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx512::create_pipeline
          (DeconvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  int *piVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  int iVar5;
  undefined8 *puVar6;
  byte *in_RSI;
  long *in_RDI;
  Option *in_stack_00000070;
  DeconvolutionDepthWise_x86_avx512 *in_stack_00000078;
  Mat weight_data_r2_2;
  Mat weight_data_r2_1;
  Mat weight_data_r2;
  int k;
  int i;
  float *p;
  float *pt;
  Mat weight_data_transposed;
  int elempack;
  int channels;
  int maxk;
  Allocator *in_stack_fffffffffffffc88;
  size_t in_stack_fffffffffffffc90;
  void **ppvVar7;
  undefined8 in_stack_fffffffffffffc98;
  Mat *in_stack_fffffffffffffca0;
  void **ppvVar8;
  Option *in_stack_fffffffffffffca8;
  undefined8 in_stack_fffffffffffffcb0;
  int _elempack;
  Mat *in_stack_fffffffffffffcb8;
  Mat *in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd08;
  void *local_2f0;
  int *local_2e8;
  long *local_2d0;
  Mat local_2a8;
  void *local_260;
  int *local_258;
  undefined8 local_250;
  undefined4 local_248;
  long *local_240;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 local_22c;
  undefined4 local_228;
  undefined8 local_220;
  int local_218;
  int local_214;
  long local_210;
  void *local_1f8;
  void *local_1f0;
  int *local_1e8;
  undefined8 local_1e0;
  undefined4 local_1d8;
  long *local_1d0;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  undefined8 local_1b0;
  int local_1a4;
  int local_1a0;
  int local_19c;
  byte *local_198;
  int local_184;
  undefined8 local_180;
  undefined8 local_178;
  undefined4 local_16c;
  void **local_168;
  void **local_160;
  long *local_158;
  void **local_150;
  Mat *local_140;
  void **local_130;
  void **local_120;
  int local_110;
  undefined4 local_10c;
  void **local_108;
  void **local_100;
  void **local_f8;
  int local_f0;
  undefined4 local_ec;
  void **local_e8;
  int local_d0;
  undefined4 local_cc;
  void **local_c8;
  int local_b0;
  undefined4 local_ac;
  void **local_a8;
  int local_90;
  undefined4 local_8c;
  Mat *local_88;
  int local_70;
  undefined4 local_6c;
  void **local_68;
  int local_60;
  undefined4 local_5c;
  undefined8 *local_58;
  void *local_50;
  void *local_18;
  void *local_8;
  
  _elempack = (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20);
  local_19c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
  uVar4 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x110) /
          (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114);
  iVar5 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
               (long)local_19c);
  local_1a0 = (iVar5 / (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114))) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114);
  if ((local_1a0 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114)) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114) ==
      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0))) {
    local_1a4 = 1;
    if ((in_RSI[0x27] & 1) != 0) {
      if (local_1a0 % 0x10 == 0) {
        local_1a4 = 0x10;
        in_stack_fffffffffffffcfc = local_1a4;
      }
      else if (local_1a0 % 8 == 0) {
        in_stack_fffffffffffffcf8 = 8;
        in_stack_fffffffffffffcfc = in_stack_fffffffffffffcf8;
        local_1a4 = in_stack_fffffffffffffcf8;
      }
      else {
        in_stack_fffffffffffffcf8 = 1;
        in_stack_fffffffffffffcfc = in_stack_fffffffffffffcf8;
        local_1a4 = in_stack_fffffffffffffcf8;
        if (local_1a0 % 4 == 0) {
          in_stack_fffffffffffffcf8 = 4;
          in_stack_fffffffffffffcfc = in_stack_fffffffffffffcf8;
          local_1a4 = in_stack_fffffffffffffcf8;
        }
      }
    }
    local_16c = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x194);
    local_168 = &local_1f0;
    local_178 = 4;
    local_180 = 0;
    local_1f0 = (void *)0x0;
    local_1e8 = (int *)0x0;
    local_1e0 = 0;
    local_1d8 = 0;
    local_1d0 = (long *)0x0;
    local_1c8 = 0;
    local_1c4 = 0;
    local_1c0 = 0;
    local_1bc = 0;
    local_1b8 = 0;
    local_1b0 = 0;
    Mat::create(in_stack_fffffffffffffca0,(int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_160 = &local_1f0;
    local_1f8 = local_1f0;
    local_158 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x168);
    local_210 = *local_158;
    for (local_214 = 0;
        local_214 <
        (local_1a0 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114)) *
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114)) *
        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114); local_214 = local_214 + 1) {
      for (local_218 = 0; local_218 < local_19c; local_218 = local_218 + 1) {
        *(undefined4 *)((long)local_1f8 + (long)((local_19c + -1) - local_218) * 4) =
             *(undefined4 *)(local_210 + (long)local_218 * 4);
      }
      local_210 = local_210 + (long)local_19c * 4;
      local_1f8 = (void *)((long)local_1f8 + (long)local_19c * 4);
    }
    if (local_1a4 == 0x10) {
      Mat::reshape((Mat *)CONCAT44(iVar5,in_stack_fffffffffffffd08),(int)((ulong)in_RDI >> 0x20),
                   (int)in_RDI,
                   (Allocator *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      convert_packing(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,_elempack,
                      in_stack_fffffffffffffca8);
      local_150 = &local_260;
      local_68 = local_150;
      if (local_258 != (int *)0x0) {
        local_6c = 0xffffffff;
        LOCK();
        local_70 = *local_258;
        *local_258 = *local_258 + -1;
        UNLOCK();
        if (local_70 == 1) {
          if (local_240 == (long *)0x0) {
            if (local_260 != (void *)0x0) {
              free(local_260);
            }
          }
          else {
            (**(code **)(*local_240 + 0x18))(local_240,local_260);
          }
        }
      }
      local_260 = (void *)0x0;
      local_250 = 0;
      local_248 = 0;
      local_238 = 0;
      local_234 = 0;
      local_230 = 0;
      local_22c = 0;
      local_228 = 0;
      local_220 = 0;
      local_258 = (int *)0x0;
    }
    if (local_1a4 == 8) {
      Mat::reshape((Mat *)CONCAT44(iVar5,in_stack_fffffffffffffd08),(int)((ulong)in_RDI >> 0x20),
                   (int)in_RDI,
                   (Allocator *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      convert_packing(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,_elempack,
                      in_stack_fffffffffffffca8);
      in_stack_fffffffffffffcc0 = &local_2a8;
      local_140 = in_stack_fffffffffffffcc0;
      local_88 = in_stack_fffffffffffffcc0;
      if (local_2a8.refcount != (int *)0x0) {
        local_8c = 0xffffffff;
        LOCK();
        local_90 = *local_2a8.refcount;
        *local_2a8.refcount = *local_2a8.refcount + -1;
        UNLOCK();
        if (local_90 == 1) {
          if (local_2a8.allocator == (Allocator *)0x0) {
            if (local_2a8.data != (void *)0x0) {
              free(local_2a8.data);
            }
          }
          else {
            (*(local_2a8.allocator)->_vptr_Allocator[3])(local_2a8.allocator,local_2a8.data);
          }
        }
      }
      in_stack_fffffffffffffcc0->data = (void *)0x0;
      in_stack_fffffffffffffcc0->elemsize = 0;
      in_stack_fffffffffffffcc0->elempack = 0;
      in_stack_fffffffffffffcc0->dims = 0;
      in_stack_fffffffffffffcc0->w = 0;
      in_stack_fffffffffffffcc0->h = 0;
      in_stack_fffffffffffffcc0->d = 0;
      in_stack_fffffffffffffcc0->c = 0;
      in_stack_fffffffffffffcc0->cstep = 0;
      in_stack_fffffffffffffcc0->refcount = (int *)0x0;
    }
    if (local_1a4 == 4) {
      Mat::reshape((Mat *)CONCAT44(iVar5,in_stack_fffffffffffffd08),(int)((ulong)in_RDI >> 0x20),
                   (int)in_RDI,
                   (Allocator *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      convert_packing(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,_elempack,
                      in_stack_fffffffffffffca8);
      ppvVar7 = &local_2f0;
      local_130 = ppvVar7;
      local_a8 = ppvVar7;
      if (local_2e8 != (int *)0x0) {
        local_ac = 0xffffffff;
        LOCK();
        local_b0 = *local_2e8;
        *local_2e8 = *local_2e8 + -1;
        UNLOCK();
        if (local_b0 == 1) {
          if (local_2d0 == (long *)0x0) {
            if (local_2f0 != (void *)0x0) {
              free(local_2f0);
            }
          }
          else {
            (**(code **)(*local_2d0 + 0x18))(local_2d0,local_2f0);
          }
        }
      }
      *ppvVar7 = (void *)0x0;
      ppvVar7[2] = (void *)0x0;
      *(undefined4 *)(ppvVar7 + 3) = 0;
      *(undefined4 *)(ppvVar7 + 5) = 0;
      *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
      *(undefined4 *)(ppvVar7 + 6) = 0;
      *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
      *(undefined4 *)(ppvVar7 + 7) = 0;
      ppvVar7[8] = (void *)0x0;
      ppvVar7[1] = (void *)0x0;
    }
    if (local_1a4 == 1) {
      ppvVar7 = (void **)(in_RDI + 4);
      local_108 = &local_1f0;
      local_100 = ppvVar7;
      local_f8 = ppvVar7;
      if (ppvVar7 != local_108) {
        if (local_1e8 != (int *)0x0) {
          local_10c = 1;
          LOCK();
          local_110 = *local_1e8;
          *local_1e8 = *local_1e8 + 1;
          UNLOCK();
        }
        ppvVar8 = ppvVar7;
        local_e8 = ppvVar7;
        if (in_RDI[5] != 0) {
          piVar1 = (int *)in_RDI[5];
          local_ec = 0xffffffff;
          LOCK();
          local_f0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_f0 == 1) {
            if (in_RDI[8] == 0) {
              local_8 = *ppvVar7;
              if (local_8 != (void *)0x0) {
                free(local_8);
              }
            }
            else {
              (**(code **)(*(long *)in_RDI[8] + 0x18))((long *)in_RDI[8],*ppvVar7);
            }
          }
        }
        *ppvVar7 = (void *)0x0;
        ppvVar7[2] = (void *)0x0;
        *(undefined4 *)(ppvVar7 + 3) = 0;
        *(undefined4 *)(ppvVar7 + 5) = 0;
        *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
        *(undefined4 *)(ppvVar7 + 6) = 0;
        *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
        *(undefined4 *)(ppvVar7 + 7) = 0;
        ppvVar7[8] = (void *)0x0;
        ppvVar7[1] = (void *)0x0;
        *ppvVar8 = *local_108;
        ppvVar8[1] = local_108[1];
        ppvVar8[2] = local_108[2];
        *(undefined4 *)(ppvVar8 + 3) = *(undefined4 *)(local_108 + 3);
        ppvVar8[4] = local_108[4];
        *(undefined4 *)(ppvVar8 + 5) = *(undefined4 *)(local_108 + 5);
        *(undefined4 *)((long)ppvVar8 + 0x2c) = *(undefined4 *)((long)local_108 + 0x2c);
        *(undefined4 *)(ppvVar8 + 6) = *(undefined4 *)(local_108 + 6);
        *(undefined4 *)((long)ppvVar8 + 0x34) = *(undefined4 *)((long)local_108 + 0x34);
        *(undefined4 *)(ppvVar8 + 7) = *(undefined4 *)(local_108 + 7);
        ppvVar8[8] = local_108[8];
        local_f8 = ppvVar8;
      }
    }
    local_184 = 0;
    ppvVar7 = &local_1f0;
    if (local_1e8 != (int *)0x0) {
      local_cc = 0xffffffff;
      LOCK();
      local_d0 = *local_1e8;
      *local_1e8 = *local_1e8 + -1;
      UNLOCK();
      if (local_d0 == 1) {
        local_120 = ppvVar7;
        local_c8 = ppvVar7;
        if (local_1d0 == (long *)0x0) {
          local_18 = local_1f0;
          if (local_1f0 != (void *)0x0) {
            free(local_1f0);
          }
        }
        else {
          (**(code **)(*local_1d0 + 0x18))(local_1d0,local_1f0);
        }
      }
    }
    *ppvVar7 = (void *)0x0;
    ppvVar7[2] = (void *)0x0;
    *(undefined4 *)(ppvVar7 + 3) = 0;
    *(undefined4 *)(ppvVar7 + 5) = 0;
    *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
    *(undefined4 *)(ppvVar7 + 6) = 0;
    *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
    *(undefined4 *)(ppvVar7 + 7) = 0;
    ppvVar7[8] = (void *)0x0;
    ppvVar7[1] = (void *)0x0;
  }
  else {
    local_198 = in_RSI;
    create_group_ops(in_stack_00000078,in_stack_00000070);
    if ((*local_198 & 1) != 0) {
      lVar2 = *(long *)(*in_RDI + -0x18);
      puVar6 = (undefined8 *)((long)in_RDI + lVar2 + 0x168);
      if (*(long *)((long)in_RDI + lVar2 + 0x170) != 0) {
        piVar1 = *(int **)((long)in_RDI + lVar2 + 0x170);
        local_5c = 0xffffffff;
        LOCK();
        local_60 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_60 == 1) {
          local_58 = puVar6;
          if (*(long *)((long)in_RDI + lVar2 + 0x188) == 0) {
            local_50 = (void *)*puVar6;
            if (local_50 != (void *)0x0) {
              free(local_50);
            }
          }
          else {
            plVar3 = *(long **)((long)in_RDI + lVar2 + 0x188);
            (**(code **)(*plVar3 + 0x18))(plVar3,*puVar6);
          }
        }
      }
      *puVar6 = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x178) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x180) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 400) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x194) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x198) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x19c) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x1a0) = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x1a8) = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x170) = 0;
    }
    local_184 = 0;
  }
  return local_184;
}

Assistant:

int DeconvolutionDepthWise_x86_avx512::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}